

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall onmt::Tokenizer::Options::validate(Options *this)

{
  bool bVar1;
  ulong uVar2;
  invalid_argument *piVar3;
  size_t sVar4;
  int *in_RDI;
  char *in_stack_00000020;
  string *alphabet;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  Options *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string local_80 [39];
  undefined1 local_59;
  string local_58 [32];
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  int *local_20;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xc),(string *)joiner_marker_abi_cxx11_);
  }
  if ((*(byte *)((long)in_RDI + 0x2a) & 1) != 0) {
    if ((*in_RDI == 4) || (*in_RDI == 3)) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar3,
                 "case_markup also enables segment_case which is not compatible with \'none\' and \'space\' tokenization modes"
                );
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    *(undefined1 *)((long)in_RDI + 0x55) = 1;
  }
  if (((*(byte *)((long)in_RDI + 0x29) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x2a) & 1) != 0)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"case_feature and case_markup can\'t be set at the same time");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((*(byte *)((long)in_RDI + 0x2e) & 1) != 0) && ((*(byte *)(in_RDI + 0x14) & 1) != 0)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"joiner_annotate and spacer_annotate can\'t be set at the same time");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((*(byte *)((long)in_RDI + 0x51) & 1) != 0) && ((*(byte *)(in_RDI + 0x14) & 1) == 0)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"spacer_new requires spacer_annotate");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((*(byte *)((long)in_RDI + 0x2f) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x2e) & 1) == 0)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"joiner_new requires joiner_annotate");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((*(byte *)(in_RDI + 0x15) & 1) != 0) &&
     (sVar4 = unicode::utf8len(in_stack_ffffffffffffff20), sVar4 != 1)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"support_prior_joiners does not support multi-character joiners");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((*(byte *)(in_RDI + 0xb) & 1) != 0) &&
     (((*(byte *)(in_RDI + 0x14) & 1) != 0 || ((*(byte *)((long)in_RDI + 0x2e) & 1) != 0)))) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,
               "spacer_annotate or joiner_annotate should not be used when with_separators is enabled since the output is already reversible"
              );
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_20 = in_RDI + 0x16;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff18);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_ffffffffffffff18);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff20,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffff18), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
    bVar1 = add_alphabet_to_segment(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (!bVar1) {
      local_59 = 1;
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::invalid_argument::invalid_argument(piVar3,local_58);
      local_59 = 0;
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = unicode::support_language_rules();
    if (!bVar1) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar3,"this build does not support language-specific rules");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::c_str();
    bVar1 = unicode::is_valid_language(in_stack_00000020);
    if (!bVar1) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      std::invalid_argument::invalid_argument(piVar3,local_80);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return;
}

Assistant:

void Tokenizer::Options::validate()
  {
    // Set default options.
    if (joiner.empty())
      joiner = joiner_marker;
    if (case_markup)
    {
      if (mode == Tokenizer::Mode::None || mode == Tokenizer::Mode::Space)
        throw std::invalid_argument("case_markup also enables segment_case which is not "
                                    "compatible with 'none' and 'space' tokenization modes");
      segment_case = true;
    }

    // Check options consistency.
    if (case_feature && case_markup)
      throw std::invalid_argument("case_feature and case_markup can't be set at the same time");
    if (joiner_annotate && spacer_annotate)
      throw std::invalid_argument("joiner_annotate and spacer_annotate can't be set at the same time");
    if (spacer_new && !spacer_annotate)
      throw std::invalid_argument("spacer_new requires spacer_annotate");
    if (joiner_new && !joiner_annotate)
      throw std::invalid_argument("joiner_new requires joiner_annotate");
    if (support_prior_joiners && unicode::utf8len(joiner) != 1)
      throw std::invalid_argument("support_prior_joiners does not support multi-character joiners");
    if (with_separators && (spacer_annotate || joiner_annotate))
      throw std::invalid_argument("spacer_annotate or joiner_annotate should not be used when "
                                  "with_separators is enabled since the output is already "
                                  "reversible");

    for (const std::string& alphabet : segment_alphabet)
    {
      if (!add_alphabet_to_segment(alphabet))
        throw std::invalid_argument("invalid Unicode script in segment_alphabet list: " + alphabet);
    }

    if (!lang.empty())
    {
      if (!unicode::support_language_rules())
        throw std::invalid_argument("this build does not support language-specific rules");
      if (!unicode::is_valid_language(lang.c_str()))
        throw std::invalid_argument("lang is not a valid ISO language code: " + lang);
    }
  }